

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O2

void __thiscall leveldb::EnvTest_RunImmediately_Test::TestBody(EnvTest_RunImmediately_Test *this)

{
  Env *pEVar1;
  RunState state;
  __native_type local_88;
  CondVar local_60;
  char local_28;
  
  local_88._16_8_ = 0;
  local_88.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_88.__align = 0;
  local_88._8_8_ = 0;
  local_88.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&local_60.cv_);
  local_28 = '\0';
  pEVar1 = (this->super_EnvTest).env_;
  local_60.mu_ = (Mutex *)&local_88;
  (*pEVar1->_vptr_Env[0x11])(pEVar1,TestBody::RunState::Run,&local_88);
  std::mutex::lock((mutex *)&local_88.__data);
  while (local_28 == '\0') {
    port::CondVar::Wait(&local_60);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&local_88);
  std::condition_variable::~condition_variable(&local_60.cv_);
  return;
}

Assistant:

TEST_F(EnvTest, RunImmediately) {
  struct RunState {
    port::Mutex mu;
    port::CondVar cvar{&mu};
    bool called = false;

    static void Run(void* arg) {
      RunState* state = reinterpret_cast<RunState*>(arg);
      MutexLock l(&state->mu);
      ASSERT_EQ(state->called, false);
      state->called = true;
      state->cvar.Signal();
    }
  };

  RunState state;
  env_->Schedule(&RunState::Run, &state);

  MutexLock l(&state.mu);
  while (!state.called) {
    state.cvar.Wait();
  }
}